

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall Liby::UdpSocket::start(UdpSocket *this)

{
  pointer this_00;
  Channel *pCVar1;
  anon_class_8_1_8991fb9c local_a8;
  BasicHandler local_a0;
  anon_class_8_1_8991fb9c local_80;
  BasicHandler local_78;
  anon_class_8_1_8991fb9c local_48;
  BasicHandler local_40;
  enable_shared_from_this<Liby::UdpSocket> local_20;
  UdpSocket *local_10;
  UdpSocket *this_local;
  
  local_10 = this;
  std::enable_shared_from_this<Liby::UdpSocket>::shared_from_this(&local_20);
  std::shared_ptr<Liby::UdpSocket>::operator=(&this->self_,(shared_ptr<Liby::UdpSocket> *)&local_20)
  ;
  std::shared_ptr<Liby::UdpSocket>::~shared_ptr((shared_ptr<Liby::UdpSocket> *)&local_20);
  this_00 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                      (&this->chan_);
  local_48.this = this;
  std::function<void()>::function<Liby::UdpSocket::start()::__0,void>
            ((function<void()> *)&local_40,&local_48);
  pCVar1 = Channel::onRead(this_00,&local_40);
  local_80.this = this;
  std::function<void()>::function<Liby::UdpSocket::start()::__1,void>
            ((function<void()> *)&local_78,&local_80);
  pCVar1 = Channel::onWrit(pCVar1,&local_78);
  local_a8.this = this;
  std::function<void()>::function<Liby::UdpSocket::start()::__2,void>
            ((function<void()> *)&local_a0,&local_a8);
  pCVar1 = Channel::onErro(pCVar1,&local_a0);
  pCVar1 = Channel::enableRead(pCVar1,true);
  Channel::addChannel(pCVar1);
  std::function<void_()>::~function(&local_a0);
  std::function<void_()>::~function(&local_78);
  std::function<void_()>::~function(&local_40);
  return;
}

Assistant:

void UdpSocket::start() {
    self_ = shared_from_this();
    chan_->onRead([this] { handleReadEvent(); })
        .onWrit([this] { handleWritEvent(); })
        .onErro([this] { handleErroEvent(); })
        .enableRead()
        .addChannel();
}